

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void compute_coherence_metrics<sparse_parameters>(lda *l,sparse_parameters *weights)

{
  uint32_t uVar1;
  pointer pfVar2;
  _Base_ptr p_Var3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  pointer puVar7;
  pointer pvVar8;
  iterator iVar9;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  _Var10;
  _Rb_tree_node_base *p_Var11;
  mapped_type *pmVar12;
  pointer puVar13;
  pointer pvVar14;
  word_doc_frequency *wdf;
  _Base_ptr p_Var15;
  ulong uVar16;
  ulong uVar17;
  pointer pvVar18;
  ulong uVar19;
  __node_base *p_Var20;
  vector<feature_pair,_std::allocator<feature_pair>_> *this;
  pointer pfVar21;
  ulong uVar22;
  feature_pair *pairs;
  __node_base *p_Var23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  initializer_list<word_doc_frequency> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> top_features_idx;
  allocator_type local_b1;
  __node_base *local_b0;
  uint64_t f2;
  anon_class_1_0_00000001 cmp;
  map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  coWordsDFSet;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  topics_word_pairs;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> vec;
  
  uVar1 = l->all->num_bits;
  topics_word_pairs.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  topics_word_pairs.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  topics_word_pairs.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ::resize(&topics_word_pairs,l->topics);
  uVar6 = 1L << ((byte)uVar1 & 0x3f);
  local_b0 = &(weights->_map)._M_h._M_before_begin;
  uVar19 = 10;
  if (uVar6 < 10) {
    uVar19 = uVar6;
  }
  for (uVar6 = 0; p_Var20 = local_b0, uVar6 < l->topics; uVar6 = uVar6 + 1) {
    top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
    ::priority_queue((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                      *)&coWordsDFSet,&cmp,
                     (vector<feature,_std::allocator<feature>_> *)&top_features_idx);
    std::_Vector_base<feature,_std::allocator<feature>_>::~_Vector_base
              ((_Vector_base<feature,_std::allocator<feature>_> *)&top_features_idx);
    uVar16 = uVar19;
    p_Var23 = p_Var20;
    while (bVar24 = uVar16 != 0, uVar16 = uVar16 - 1, bVar24) {
      p_Var23 = p_Var23->_M_nxt;
      top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = *(pointer *)(p_Var23 + 1);
      top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(top_features_idx.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             *(undefined4 *)
                              ((long)&(*(_Hash_node_base **)
                                        &((_Prime_rehash_policy *)(p_Var23 + 2))->_M_max_load_factor
                                      )->_M_nxt + uVar6 * 4));
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
      ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
              *)&coWordsDFSet,(value_type *)&top_features_idx);
    }
    while (p_Var20 = p_Var20->_M_nxt, p_Var20 != (__node_base *)0x0) {
      fVar26 = *(float *)((long)&(*(_Hash_node_base **)
                                   &((_Prime_rehash_policy *)(p_Var20 + 2))->_M_max_load_factor)->
                                 _M_nxt + uVar6 * 4);
      if (*(float *)coWordsDFSet._M_t._M_impl._0_8_ <= fVar26 &&
          fVar26 != *(float *)coWordsDFSet._M_t._M_impl._0_8_) {
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
               *)&coWordsDFSet);
        top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = *(pointer *)(p_Var20 + 1);
        top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(top_features_idx.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               *(undefined4 *)
                                ((long)&(*(_Hash_node_base **)
                                          &((_Prime_rehash_policy *)(p_Var20 + 2))->
                                           _M_max_load_factor)->_M_nxt + uVar6 * 4));
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                *)&coWordsDFSet,(value_type *)&top_features_idx);
      }
    }
    top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&top_features_idx,
               CONCAT44(coWordsDFSet._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                        coWordsDFSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color) -
               coWordsDFSet._M_t._M_impl._0_8_ >> 4);
    for (uVar16 = (ulong)(CONCAT44(coWordsDFSet._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                                   coWordsDFSet._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_color) - coWordsDFSet._M_t._M_impl._0_8_) >> 4 & 0xffffffff;
        0 < (int)uVar16; uVar16 = uVar16 - 1) {
      top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16 - 1] =
           *(unsigned_long *)(coWordsDFSet._M_t._M_impl._0_8_ + 8);
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
      ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
             *)&coWordsDFSet);
    }
    this = topics_word_pairs.
           super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar6;
    puVar7 = top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar13 = top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar16 = 0;
    while (uVar22 = uVar16, uVar22 < (ulong)((long)puVar13 - (long)puVar7 >> 3)) {
      for (uVar17 = uVar22 + 1; uVar16 = uVar22 + 1,
          uVar17 < (ulong)((long)puVar13 - (long)puVar7 >> 3); uVar17 = uVar17 + 1) {
        vec.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)puVar7[uVar22];
        vec.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)puVar7[uVar17];
        std::vector<feature_pair,_std::allocator<feature_pair>_>::emplace_back<feature_pair>
                  (this,(feature_pair *)&vec);
        puVar7 = top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar13 = top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<feature,_std::allocator<feature>_>::~_Vector_base
              ((_Vector_base<feature,_std::allocator<feature>_> *)&coWordsDFSet);
  }
  coWordsDFSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &coWordsDFSet._M_t._M_impl.super__Rb_tree_header._M_header;
  coWordsDFSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  coWordsDFSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  coWordsDFSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0 = (__node_base *)
             topics_word_pairs.
             super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  coWordsDFSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       coWordsDFSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pvVar8 = topics_word_pairs.
                super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var11 = coWordsDFSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      pvVar8 != (pointer)local_b0; pvVar8 = pvVar8 + 1) {
    pfVar2 = (pvVar8->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pfVar21 = (pvVar8->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl
                   .super__Vector_impl_data._M_start; pfVar21 != pfVar2; pfVar21 = pfVar21 + 1) {
      _cmp = (pointer)pfVar21->f1;
      f2 = pfVar21->f2;
      iVar9 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
              ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                      *)&coWordsDFSet,(key_type *)&cmp);
      if ((_Rb_tree_header *)iVar9._M_node == &coWordsDFSet._M_t._M_impl.super__Rb_tree_header) {
        top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)f2;
        top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)top_features_idx.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
        __l._M_len = 1;
        __l._M_array = (iterator)&top_features_idx;
        std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::vector
                  ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   &vec.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>,
                   __l,&local_b1);
        top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = _cmp;
        std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::vector
                  ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   &top_features_idx.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish,
                   (vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   &vec.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>)
        ;
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>>
        ::
        _M_emplace_unique<std::pair<unsigned_long,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>
                  ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>>
                    *)&coWordsDFSet,
                   (pair<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                    *)&top_features_idx);
        std::_Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>::~_Vector_base
                  ((_Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   &top_features_idx.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        std::_Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>::~_Vector_base
                  (&vec.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>)
        ;
      }
      else {
        _Var10 = std::
                 __find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,__gnu_cxx::__ops::_Iter_pred<compute_coherence_metrics<sparse_parameters>(lda&,sparse_parameters&)::_lambda(word_doc_frequency_const&)_1_>>
                           (iVar9._M_node[1]._M_parent,iVar9._M_node[1]._M_left,&f2);
        if ((_Base_ptr)_Var10._M_current != iVar9._M_node[1]._M_left) {
          top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)f2;
          top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish =
               (pointer)((ulong)top_features_idx.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
          std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::
          emplace_back<word_doc_frequency>
                    ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                     &iVar9._M_node[1]._M_parent,(word_doc_frequency *)&top_features_idx);
        }
      }
    }
  }
  do {
    if ((_Rb_tree_header *)p_Var11 == &coWordsDFSet._M_t._M_impl.super__Rb_tree_header) {
      fVar26 = 0.0;
      pvVar8 = (pointer)0x0;
      while (pvVar8 < (pointer)l->topics) {
        pfVar2 = topics_word_pairs.
                 super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)pvVar8].
                 super__Vector_base<feature_pair,_std::allocator<feature_pair>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        fVar27 = 0.0;
        local_b0 = (__node_base *)pvVar8;
        for (pfVar21 = topics_word_pairs.
                       super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pvVar8].
                       super__Vector_base<feature_pair,_std::allocator<feature_pair>_>._M_impl.
                       super__Vector_impl_data._M_start; p_Var20 = local_b0, pfVar21 != pfVar2;
            pfVar21 = pfVar21 + 1) {
          top_features_idx.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)pfVar21->f1;
          if ((l->feature_counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start
              [(long)top_features_idx.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start] != 0) {
            vec.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)pfVar21->f2;
            pmVar12 = std::
                      map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                      ::operator[](&coWordsDFSet,(key_type *)&top_features_idx);
            _Var10 = std::
                     __find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,__gnu_cxx::__ops::_Iter_pred<compute_coherence_metrics<sparse_parameters>(lda&,sparse_parameters&)::_lambda(word_doc_frequency_const&)_2_>>
                               ((pmVar12->
                                super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                )._M_impl.super__Vector_impl_data._M_start,
                                (pmVar12->
                                super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                )._M_impl.super__Vector_impl_data._M_finish,&vec);
            if (_Var10._M_current !=
                (pmVar12->
                super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>)._M_impl
                .super__Vector_impl_data._M_finish) {
              fVar25 = logf(((float)(_Var10._M_current)->count + 1e-06) /
                            (float)(l->feature_counts).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [(long)top_features_idx.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start]);
              fVar27 = fVar27 + fVar25;
            }
          }
        }
        printf("Topic %3d coherence: %f\n",SUB84((double)fVar27,0),(ulong)local_b0 & 0xffffffff);
        fVar26 = fVar26 + fVar27;
        pvVar8 = (pointer)((long)&(((_Vector_base<feature_pair,_std::allocator<feature_pair>_> *)
                                   &p_Var20->_M_nxt)->_M_impl).super__Vector_impl_data._M_start + 1)
        ;
      }
      printf("Avg topic coherence: %f\n",SUB84((double)(fVar26 / (float)(pointer)l->topics),0));
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
      ::~_Rb_tree(&coWordsDFSet._M_t);
      std::
      vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
      ::~vector(&topics_word_pairs);
      return;
    }
    pvVar14 = (l->feature_to_example_map).
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + *(long *)(p_Var11 + 1);
    p_Var15 = p_Var11[1]._M_parent;
    p_Var3 = p_Var11[1]._M_left;
LAB_0017e4d6:
    if (p_Var15 != p_Var3) {
      pvVar18 = (l->feature_to_example_map).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var15;
      uVar19 = 0;
      uVar6 = 0;
      do {
        lVar4 = *(long *)&(pvVar14->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data;
        while( true ) {
          if (((ulong)((long)*(pointer *)
                              ((long)&(pvVar14->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data + 8) - lVar4 >> 3) <= uVar19
              ) || (lVar5 = *(long *)&(pvVar18->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data,
                   (ulong)((long)*(pointer *)
                                  ((long)&(pvVar18->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data + 8) - lVar5 >> 3) <=
                   uVar6)) {
            p_Var15 = (_Base_ptr)&p_Var15->_M_left;
            goto LAB_0017e4d6;
          }
          uVar16 = *(ulong *)(lVar4 + uVar19 * 8);
          uVar22 = *(ulong *)(lVar5 + uVar6 * 8);
          if (uVar16 == uVar22) break;
          if (uVar16 <= uVar22) goto LAB_0017e52c;
          uVar6 = uVar6 + 1;
        }
        *(int *)&p_Var15->_M_parent = *(int *)&p_Var15->_M_parent + 1;
        uVar6 = uVar6 + 1;
LAB_0017e52c:
        uVar19 = uVar19 + 1;
      } while( true );
    }
    p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
  } while( true );
}

Assistant:

void compute_coherence_metrics(lda &l, T &weights)
{
  uint64_t length = (uint64_t)1 << l.all->num_bits;

  std::vector<std::vector<feature_pair>> topics_word_pairs;
  topics_word_pairs.resize(l.topics);

  int top_words_count = 10;  // parameterize and check

  for (size_t topic = 0; topic < l.topics; topic++)
  {
    // get top features for this topic
    auto cmp = [](feature &left, feature &right) { return left.x > right.x; };
    std::priority_queue<feature, std::vector<feature>, decltype(cmp)> top_features(cmp);
    typename T::iterator iter = weights.begin();
    for (uint64_t i = 0; i < min(top_words_count, length); i++, ++iter)
      top_features.push(feature((&(*iter))[topic], iter.index()));

    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if ((&(*v))[topic] > top_features.top().x)
      {
        top_features.pop();
        top_features.push(feature((&(*v))[topic], v.index()));
      }

    // extract idx and sort descending
    vector<uint64_t> top_features_idx;
    top_features_idx.resize(top_features.size());
    for (int i = (int)top_features.size() - 1; i >= 0; i--)
    {
      top_features_idx[i] = top_features.top().weight_index;
      top_features.pop();
    }

    auto &word_pairs = topics_word_pairs[topic];
    for (size_t i = 0; i < top_features_idx.size(); i++)
      for (size_t j = i + 1; j < top_features_idx.size(); j++)
        word_pairs.push_back(feature_pair(top_features_idx[i], top_features_idx[j]));
  }

  // compress word pairs and create record for storing frequency
  std::map<uint64_t, std::vector<word_doc_frequency>> coWordsDFSet;
  for (auto &vec : topics_word_pairs)
  {
    for (auto &wp : vec)
    {
      auto f1 = wp.f1;
      auto f2 = wp.f2;
      auto wdf = coWordsDFSet.find(f1);

      if (wdf != coWordsDFSet.end())
      {
        // http://stackoverflow.com/questions/5377434/does-stdmapiterator-return-a-copy-of-value-or-a-value-itself
        // if (wdf->second.find(f2) == wdf->second.end())

        if (std::find_if(wdf->second.begin(), wdf->second.end(),
                [&f2](const word_doc_frequency &v) { return v.idx == f2; }) != wdf->second.end())
        {
          wdf->second.push_back({f2, 0});
          // printf(" add %d %d\n", f1, f2);
        }
      }
      else
      {
        std::vector<word_doc_frequency> vec = {{f2, 0}};
        coWordsDFSet.insert(std::make_pair(f1, vec));
        // printf(" insert %d %d\n", f1, f2);
      }
    }
  }

  // this.GetWordPairsDocumentFrequency(coWordsDFSet);
  for (auto &pair : coWordsDFSet)
  {
    auto &examples_for_f1 = l.feature_to_example_map[pair.first];
    for (auto &wdf : pair.second)
    {
      auto &examples_for_f2 = l.feature_to_example_map[wdf.idx];

      // assumes examples_for_f1 and examples_for_f2 are orderd
      size_t i = 0;
      size_t j = 0;
      while (i < examples_for_f1.size() && j < examples_for_f2.size())
      {
        if (examples_for_f1[i] == examples_for_f2[j])
        {
          wdf.count++;
          i++;
          j++;
        }
        else if (examples_for_f2[j] < examples_for_f1[i])
          j++;
        else
          i++;
      }
    }
  }

  float epsilon = 1e-6f;  // TODO
  float avg_coherence = 0;
  for (size_t topic = 0; topic < l.topics; topic++)
  {
    float coherence = 0;

    for (auto &pairs : topics_word_pairs[topic])
    {
      auto f1 = pairs.f1;
      if (l.feature_counts[f1] == 0)
        continue;

      auto f2 = pairs.f2;
      auto &co_feature = coWordsDFSet[f1];
      auto co_feature_df = std::find_if(
          co_feature.begin(), co_feature.end(), [&f2](const word_doc_frequency &v) { return v.idx == f2; });

      if (co_feature_df != co_feature.end())
      {
        // printf("(%d:%d + eps)/(%d:%d)\n", f2, co_feature_df->count, f1, l.feature_counts[f1]);
        coherence += logf((co_feature_df->count + epsilon) / l.feature_counts[f1]);
      }
    }

    printf("Topic %3d coherence: %f\n", (int)topic, coherence);

    // TODO: expose per topic coherence

    // TODO: good vs. bad topics
    avg_coherence += coherence;
  }

  avg_coherence /= l.topics;

  printf("Avg topic coherence: %f\n", avg_coherence);
}